

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::setting_args::test_method(setting_args *this)

{
  long lVar1;
  string str;
  string str_00;
  string str_01;
  string sVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  check_type cVar5;
  undefined8 in_stack_ffffffffffffeb28;
  undefined8 in_stack_ffffffffffffeb30;
  undefined8 in_stack_ffffffffffffeb38;
  undefined8 in_stack_ffffffffffffeb40;
  char *local_14b0;
  char *local_14a8;
  char *local_14a0;
  char *local_1498;
  undefined1 *local_1490;
  undefined1 *local_1488;
  char *local_1480;
  char *local_1478;
  char *local_1470;
  char *local_1468;
  undefined1 *local_1460;
  undefined1 *local_1458;
  char *local_1450;
  char *local_1448;
  char *local_1440;
  char *local_1438;
  undefined1 *local_1430;
  undefined1 *local_1428;
  char *local_1420;
  char *local_1418;
  char *local_1410;
  char *local_1408;
  undefined1 *local_1400;
  undefined1 *local_13f8;
  char *local_13f0;
  char *local_13e8;
  char *local_13b0;
  char *local_13a8;
  undefined1 *local_13a0;
  undefined1 *local_1398;
  char *local_1390;
  char *local_1388;
  undefined1 *local_1380;
  undefined1 *local_1378;
  char *local_1370;
  char *local_1368;
  char *local_1330;
  char *local_1328;
  undefined1 *local_1320;
  undefined1 *local_1318;
  char *local_1310;
  char *local_1308;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  undefined1 *local_1280;
  undefined1 *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  char *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11d8;
  undefined1 *local_11d0;
  undefined1 *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  undefined1 *local_1150;
  undefined1 *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1100;
  char *local_10f8;
  undefined1 *local_10f0;
  undefined1 *local_10e8;
  char *local_10e0;
  char *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_1080;
  char *local_1078;
  undefined1 *local_1070;
  undefined1 *local_1068;
  char *local_1060;
  char *local_1058;
  undefined1 *local_1050;
  undefined1 *local_1048;
  char *local_1040;
  char *local_1038;
  undefined8 local_1030;
  char *local_1000;
  char *local_ff8;
  undefined1 *local_ff0;
  undefined1 *local_fe8;
  char *local_fe0;
  char *local_fd8;
  undefined1 *local_fd0;
  undefined1 *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  char *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  char *local_f78;
  undefined1 *local_f70;
  undefined1 *local_f68;
  char *local_f60;
  char *local_f58;
  char *local_f50;
  char *local_f48;
  undefined1 *local_f40;
  undefined1 *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  char *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  char *local_ee8;
  undefined1 *local_ee0;
  undefined1 *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  char *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  undefined1 *local_df0;
  undefined1 *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  undefined1 *local_dc0;
  undefined1 *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_d70;
  char *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  undefined1 *local_c90;
  undefined1 *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  undefined1 *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  undefined1 *local_c30;
  undefined1 *local_c28;
  char *local_c20;
  char *local_c18;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b60;
  char *local_b58;
  undefined1 *local_b50;
  undefined1 *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  allocator<char> local_449;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  allocator<char> local_411;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  anon_class_8_1_89897ddb set_foo;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  string local_3b8;
  undefined1 *local_398;
  undefined8 local_390;
  undefined1 local_388 [16];
  string local_378;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348 [16];
  string local_338;
  undefined1 local_318 [32];
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e8;
  undefined1 local_2d8 [16];
  undefined1 *local_2c8;
  char *local_2c0 [8];
  ArgsManager args;
  
  local_1030 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&args);
  local_318._0_4_ = VOBJ;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_2d8,(char (*) [5])0xba89f1,(Flags *)local_318);
  __l._M_len = 1;
  __l._M_array = (iterator)local_2d8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_2f8,__l,(allocator_type *)&local_338);
  SetupArgs(&args,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)local_2f8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d8);
  set_foo.args = &args;
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>((UniValue *)local_2d8,(char (*) [4])0xb91784)
  ;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x45;
  file.m_begin = (iterator)&local_3f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_400,msg);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_408 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (local_2f8,&local_410,0x45,1,2,pvVar4,"args.GetSetting(\"foo\").write()","\"str\"",
             "\"\\\"str\\\"\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x46;
  file_00.m_begin = (iterator)&local_428;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_438,
             msg_00);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_440 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_2d8,&local_448,0x46,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","str",
             "\"str\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x47;
  file_01.m_begin = (iterator)&local_460;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_470,
             msg_01);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_478 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_480,0x47,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"0");
  std::__cxx11::string::~string((string *)local_2f8);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x48;
  file_02.m_begin = (iterator)&local_490;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4a0,
             msg_02);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4a8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_4b0,0x48,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x49;
  file_03.m_begin = (iterator)&local_4c0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4d0,
             msg_03);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4d8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_4e0,0x49,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  UniValue::UniValue<const_char_(&)[3],_char[3],_true>((UniValue *)local_2d8,(char (*) [3])0xc984d1)
  ;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4c;
  file_04.m_begin = (iterator)&local_4f0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_500,
             msg_04);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_508 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2f8,&local_510,0x4c,1,2,pvVar4,"args.GetSetting(\"foo\").write()","\"99\"",
             "\"\\\"99\\\"\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4d;
  file_05.m_begin = (iterator)&local_520;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_530,
             msg_05);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_538 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2d8,&local_540,0x4d,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","99","\"99\"")
  ;
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4e;
  file_06.m_begin = (iterator)&local_550;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_560,
             msg_06);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_568 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 99;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_570,0x4e,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"99");
  std::__cxx11::string::~string((string *)local_2f8);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4f;
  file_07.m_begin = (iterator)&local_580;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_590,
             msg_07);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_598 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_5a0,0x4f,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,"true"
            );
  std::__cxx11::string::~string((string *)local_2f8);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = &DAT_00000050;
  file_08.m_begin = (iterator)&local_5b0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5c0,
             msg_08);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_5c8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_5d0,0x50,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "true");
  std::__cxx11::string::~string((string *)local_2f8);
  UniValue::UniValue<const_char_(&)[5],_char[5],_true>((UniValue *)local_2d8,(char (*) [5])"3.25");
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x53;
  file_09.m_begin = (iterator)&local_5e0;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5f0,
             msg_09);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_5f8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_2f8,&local_600,0x53,1,2,pvVar4,"args.GetSetting(\"foo\").write()","\"3.25\"",
             "\"\\\"3.25\\\"\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x54;
  file_10.m_begin = (iterator)&local_610;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_620,
             msg_10);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_628 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2d8,&local_630,0x54,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","3.25",
             "\"3.25\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x55;
  file_11.m_begin = (iterator)&local_640;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_650,
             msg_11);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_658 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 3;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_660,0x55,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"3");
  std::__cxx11::string::~string((string *)local_2f8);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x56;
  file_12.m_begin = (iterator)&local_670;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_680,
             msg_12);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_688 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_690,0x56,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,"true"
            );
  std::__cxx11::string::~string((string *)local_2f8);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x57;
  file_13.m_begin = (iterator)&local_6a0;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_6b0,
             msg_13);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_6b8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_6c0,0x57,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "true");
  std::__cxx11::string::~string((string *)local_2f8);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>((UniValue *)local_2d8,(char (*) [2])0xcd0fcb)
  ;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5a;
  file_14.m_begin = (iterator)&local_6d0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6e0,
             msg_14);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_6e8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (local_2f8,&local_6f0,0x5a,1,2,pvVar4,"args.GetSetting(\"foo\").write()","\"0\"",
             "\"\\\"0\\\"\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x5b;
  file_15.m_begin = (iterator)&local_700;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_710,
             msg_15);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_718 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_2d8,&local_720,0x5b,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","0","\"0\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x5c;
  file_16.m_begin = (iterator)&local_730;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_740,
             msg_16);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_748 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_750,0x5c,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"0");
  std::__cxx11::string::~string((string *)local_2f8);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x5d;
  file_17.m_begin = (iterator)&local_760;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_770,
             msg_17);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_778 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_780,0x5d,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x5e;
  file_18.m_begin = (iterator)&local_790;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_7a0,
             msg_18);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_7a8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_7b0,0x5e,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>((UniValue *)local_2d8,(char (*) [1])0xc7f1cc)
  ;
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x61;
  file_19.m_begin = (iterator)&local_7c0;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_7d0,
             msg_19);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_7d8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2f8,&local_7e0,0x61,1,2,pvVar4,"args.GetSetting(\"foo\").write()","\"\"",
             "\"\\\"\\\"\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x62;
  file_20.m_begin = (iterator)&local_7f0;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_800,
             msg_20);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_808 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_2d8,&local_810,0x62,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","","\"\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x63;
  file_21.m_begin = (iterator)&local_820;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_830,
             msg_21);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_838 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_840,99,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"0");
  std::__cxx11::string::~string((string *)local_2f8);
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x64;
  file_22.m_begin = (iterator)&local_850;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_860,
             msg_22);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_870 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_868 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_870,100,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,"true")
  ;
  std::__cxx11::string::~string((string *)local_2f8);
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x65;
  file_23.m_begin = (iterator)&local_880;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_890,
             msg_23);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_898 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_8a0,0x65,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "true");
  std::__cxx11::string::~string((string *)local_2f8);
  local_2f8._0_4_ = 99;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_2d8,(int *)local_2f8);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_8b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = &DAT_00000068;
  file_24.m_begin = (iterator)&local_8b0;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_8c0,
             msg_24);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_8c8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2f8,&local_8d0,0x68,1,2,pvVar4,"args.GetSetting(\"foo\").write()","99","\"99\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x69;
  file_25.m_begin = (iterator)&local_8e0;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_8f0,
             msg_25);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_900 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_8f8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2d8,&local_900,0x69,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","99","\"99\"")
  ;
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x6a;
  file_26.m_begin = (iterator)&local_910;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_920,
             msg_26);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_930 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_928 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 99;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_930,0x6a,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"99");
  std::__cxx11::string::~string((string *)local_2f8);
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x6b;
  file_27.m_begin = (iterator)&local_940;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_950,
             msg_27);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,true);
  std::__cxx11::string::~string((string *)local_2d8);
  local_960 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x339e53;
  file_28.m_end = (iterator)0x6b;
  file_28.m_begin = (iterator)&local_960;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_970,
             msg_28);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_978 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_980,0x6b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_9c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x6c;
  file_29.m_begin = (iterator)&local_9c0;
  msg_29.m_end = pvVar3;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_9d0,
             msg_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,false);
  std::__cxx11::string::~string((string *)local_2d8);
  local_9e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x339f60;
  file_30.m_end = (iterator)0x6c;
  file_30.m_begin = (iterator)&local_9e0;
  msg_30.m_end = pvVar3;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_9f0,
             msg_30);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_9f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_a00,0x6c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_2f8._0_8_ = (pointer)0x400a000000000000;
  UniValue::UniValue<double,_double,_true>((UniValue *)local_2d8,(double *)local_2f8);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_a40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x6f;
  file_31.m_begin = (iterator)&local_a40;
  msg_31.m_end = pvVar3;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_a50,
             msg_31);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_a58 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2f8,&local_a60,0x6f,1,2,pvVar4,"args.GetSetting(\"foo\").write()","3.25",
             "\"3.25\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x70;
  file_32.m_begin = (iterator)&local_a70;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_a80,
             msg_32);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_a88 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2d8,&local_a90,0x70,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","3.25",
             "\"3.25\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_aa0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x71;
  file_33.m_begin = (iterator)&local_aa0;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_ab0,
             msg_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetIntArg(&args,(string *)local_2d8,100);
  std::__cxx11::string::~string((string *)local_2d8);
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33a324;
  file_34.m_end = (iterator)0x71;
  file_34.m_begin = (iterator)&local_ac0;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_ad0,
             msg_34);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_ae0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ad8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_ae0,0x71);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_b20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x72;
  file_35.m_begin = (iterator)&local_b20;
  msg_35.m_end = pvVar3;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_b30,
             msg_35);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,true);
  std::__cxx11::string::~string((string *)local_2d8);
  local_b40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_b38 = "";
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33a432;
  file_36.m_end = (iterator)0x72;
  file_36.m_begin = (iterator)&local_b40;
  msg_36.m_end = pvVar3;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_b50,
             msg_36);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_b60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_b58 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_b60,0x72);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_ba0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_b98 = "";
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x73;
  file_37.m_begin = (iterator)&local_ba0;
  msg_37.m_end = pvVar3;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_bb0,
             msg_37);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,false);
  std::__cxx11::string::~string((string *)local_2d8);
  local_bc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_bb8 = "";
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33a53f;
  file_38.m_end = (iterator)0x73;
  file_38.m_begin = (iterator)&local_bc0;
  msg_38.m_end = pvVar3;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_bd0,
             msg_38);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_be0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_bd8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_be0,0x73);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffff00000000;
  UniValue::UniValue<int,_int,_true>((UniValue *)local_2d8,(int *)local_2f8);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_c20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c18 = "";
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x76;
  file_39.m_begin = (iterator)&local_c20;
  msg_39.m_end = pvVar3;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_c30,
             msg_39);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c38 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_2f8,&local_c40,0x76,1,2,pvVar4,"args.GetSetting(\"foo\").write()","0","\"0\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_c50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c48 = "";
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x77;
  file_40.m_begin = (iterator)&local_c50;
  msg_40.m_end = pvVar4;
  msg_40.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_c60,
             msg_40);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c68 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_2d8,&local_c70,0x77,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","0","\"0\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_c80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c78 = "";
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x78;
  file_41.m_begin = (iterator)&local_c80;
  msg_41.m_end = pvVar4;
  msg_41.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_c90,
             msg_41);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_ca0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_c98 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_ca0,0x78,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"0");
  std::__cxx11::string::~string((string *)local_2f8);
  local_cb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ca8 = "";
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x79;
  file_42.m_begin = (iterator)&local_cb0;
  msg_42.m_end = pvVar4;
  msg_42.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_cc0,
             msg_42);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,true);
  std::__cxx11::string::~string((string *)local_2d8);
  local_cd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_cc8 = "";
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33a9f2;
  file_43.m_end = (iterator)0x79;
  file_43.m_begin = (iterator)&local_cd0;
  msg_43.m_end = pvVar4;
  msg_43.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_ce0,
             msg_43);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_cf0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ce8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_cf0,0x79);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_d30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x7a;
  file_44.m_begin = (iterator)&local_d30;
  msg_44.m_end = pvVar3;
  msg_44.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_d40,
             msg_44);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,false);
  std::__cxx11::string::~string((string *)local_2d8);
  local_d50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_d48 = "";
  local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33aaff;
  file_45.m_end = (iterator)0x7a;
  file_45.m_begin = (iterator)&local_d50;
  msg_45.m_end = pvVar3;
  msg_45.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_d60,
             msg_45);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_d70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_d68 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_d70,0x7a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_2f8[0] = 1;
  UniValue::UniValue<bool,_bool,_true>((UniValue *)local_2d8,(bool *)local_2f8);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_db0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_da8 = "";
  local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x7d;
  file_46.m_begin = (iterator)&local_db0;
  msg_46.m_end = pvVar3;
  msg_46.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_dc0,
             msg_46);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_dd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_dc8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2f8,&local_dd0,0x7d,1,2,pvVar4,"args.GetSetting(\"foo\").write()","true",
             "\"true\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_de0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_dd8 = "";
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x7e;
  file_47.m_begin = (iterator)&local_de0;
  msg_47.m_end = pvVar4;
  msg_47.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_df0,
             msg_47);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_e00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_df8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_2d8,&local_e00,0x7e,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","1","\"1\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_e10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e08 = "";
  local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x7f;
  file_48.m_begin = (iterator)&local_e10;
  msg_48.m_end = pvVar4;
  msg_48.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_e20,
             msg_48);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_e30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e28 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_e30,0x7f,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"1");
  std::__cxx11::string::~string((string *)local_2f8);
  local_e40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e38 = "";
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x80;
  file_49.m_begin = (iterator)&local_e40;
  msg_49.m_end = pvVar4;
  msg_49.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_e50,
             msg_49);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_e60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e58 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_e60,0x80,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,"true"
            );
  std::__cxx11::string::~string((string *)local_2f8);
  local_e70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e68 = "";
  local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x81;
  file_50.m_begin = (iterator)&local_e70;
  msg_50.m_end = pvVar4;
  msg_50.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_e80,
             msg_50);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_e90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e88 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_e90,0x81,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "true");
  std::__cxx11::string::~string((string *)local_2f8);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  UniValue::UniValue<bool,_bool,_true>((UniValue *)local_2d8,(bool *)local_2f8);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(SettingsValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  local_ea0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_e98 = "";
  local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x84;
  file_51.m_begin = (iterator)&local_ea0;
  msg_51.m_end = pvVar4;
  msg_51.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_eb0,
             msg_51);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ec0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_eb8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (local_2f8,&local_ec0,0x84,1,2,pvVar4,"args.GetSetting(\"foo\").write()","false",
             "\"false\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_ed0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ec8 = "";
  local_ee0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x85;
  file_52.m_begin = (iterator)&local_ed0;
  msg_52.m_end = pvVar4;
  msg_52.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_ee0,
             msg_52);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_ef0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ee8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
            (local_2d8,&local_ef0,0x85,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","0","\"0\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_f00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ef8 = "";
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x86;
  file_53.m_begin = (iterator)&local_f00;
  msg_53.m_end = pvVar4;
  msg_53.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_f10,
             msg_53);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_f20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f18 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_f20,0x86,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"0");
  std::__cxx11::string::~string((string *)local_2f8);
  local_f30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f28 = "";
  local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x87;
  file_54.m_begin = (iterator)&local_f30;
  msg_54.m_end = pvVar4;
  msg_54.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_f40,
             msg_54);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_f50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f48 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_f50,0x87,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  local_f60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f58 = "";
  local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x88;
  file_55.m_begin = (iterator)&local_f60;
  msg_55.m_end = pvVar4;
  msg_55.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_f70,
             msg_55);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_f80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f78 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_f80,0x88,1,2,pvVar4,"args.GetBoolArg(\"foo\", false)",&local_411,
             "false");
  std::__cxx11::string::~string((string *)local_2f8);
  local_358 = local_348;
  local_350 = 0;
  local_348[0] = 0;
  str._M_string_length = in_stack_ffffffffffffeb30;
  str._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb28;
  str.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  str.field_2._8_8_ = in_stack_ffffffffffffeb40;
  UniValue::UniValue((UniValue *)local_2d8,VOBJ,str);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(UniValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_358);
  local_f90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_f88 = "";
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x8b;
  file_56.m_begin = (iterator)&local_f90;
  msg_56.m_end = pvVar4;
  msg_56.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_fa0,
             msg_56);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_fb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_fa8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2f8,&local_fb0,0x8b,1,2,pvVar4,"args.GetSetting(\"foo\").write()","{}","\"{}\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_fc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_fb8 = "";
  local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x8c;
  file_57.m_begin = (iterator)&local_fc0;
  msg_57.m_end = pvVar4;
  msg_57.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_fd0,
             msg_57);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"default",(allocator<char> *)&local_338);
  ArgsManager::GetArg(&local_378,&args,(string *)local_2d8,(string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d8);
  local_fe0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_fd8 = "";
  local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fe8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33b98a;
  file_58.m_end = (iterator)0x8c;
  file_58.m_begin = (iterator)&local_fe0;
  msg_58.m_end = pvVar4;
  msg_58.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_ff0,
             msg_58);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1000 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_ff8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1000,0x8c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_1040 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1038 = "";
  local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x8d;
  file_59.m_begin = (iterator)&local_1040;
  msg_59.m_end = pvVar3;
  msg_59.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_1050,
             msg_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetIntArg(&args,(string *)local_2d8,100);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1060 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1058 = "";
  local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33ba9e;
  file_60.m_end = (iterator)0x8d;
  file_60.m_begin = (iterator)&local_1060;
  msg_60.m_end = pvVar3;
  msg_60.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_1070,
             msg_60);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1080 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1078 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1080,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_10c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_10b8 = "";
  local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x8e;
  file_61.m_begin = (iterator)&local_10c0;
  msg_61.m_end = pvVar3;
  msg_61.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_10d0,
             msg_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,true);
  std::__cxx11::string::~string((string *)local_2d8);
  local_10e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_10d8 = "";
  local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10e8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33bbb2;
  file_62.m_end = (iterator)0x8e;
  file_62.m_begin = (iterator)&local_10e0;
  msg_62.m_end = pvVar3;
  msg_62.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_10f0,
             msg_62);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_10f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1100,0x8e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_1140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1138 = "";
  local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x8f;
  file_63.m_begin = (iterator)&local_1140;
  msg_63.m_end = pvVar3;
  msg_63.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_1150,
             msg_63);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,false);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1158 = "";
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33bcc5;
  file_64.m_end = (iterator)0x8f;
  file_64.m_begin = (iterator)&local_1160;
  msg_64.m_end = pvVar3;
  msg_64.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_1170,
             msg_64);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1178 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1180,0x8f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_398 = local_388;
  local_390 = 0;
  local_388[0] = 0;
  str_00._M_string_length = in_stack_ffffffffffffeb30;
  str_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb28;
  str_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  str_00.field_2._8_8_ = in_stack_ffffffffffffeb40;
  UniValue::UniValue((UniValue *)local_2d8,VARR,str_00);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(UniValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_398);
  local_11c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_11b8 = "";
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0x92;
  file_65.m_begin = (iterator)&local_11c0;
  msg_65.m_end = pvVar3;
  msg_65.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_11d0,
             msg_65);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_11e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_11d8 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
            (local_2f8,&local_11e0,0x92,1,2,pvVar4,"args.GetSetting(\"foo\").write()","[]","\"[]\"")
  ;
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_11f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_11e8 = "";
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x93;
  file_66.m_begin = (iterator)&local_11f0;
  msg_66.m_end = pvVar4;
  msg_66.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_1200,
             msg_66);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"default",(allocator<char> *)&local_338);
  ArgsManager::GetArg(&local_3b8,&args,(string *)local_2d8,(string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1208 = "";
  local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33bfac;
  file_67.m_end = (iterator)0x93;
  file_67.m_begin = (iterator)&local_1210;
  msg_67.m_end = pvVar4;
  msg_67.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_1220,
             msg_67);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1228 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1230,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_1270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1268 = "";
  local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x94;
  file_68.m_begin = (iterator)&local_1270;
  msg_68.m_end = pvVar3;
  msg_68.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_1280,
             msg_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetIntArg(&args,(string *)local_2d8,100);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33c0c0;
  file_69.m_end = (iterator)0x94;
  file_69.m_begin = (iterator)&local_1290;
  msg_69.m_end = pvVar3;
  msg_69.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_12a0,
             msg_69);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_12b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_12a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_12b0,0x94);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_12e8 = "";
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_70.m_end = (iterator)0x95;
  file_70.m_begin = (iterator)&local_12f0;
  msg_70.m_end = pvVar3;
  msg_70.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_1300,
             msg_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,true);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1308 = "";
  local_1320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1318 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33c1d4;
  file_71.m_end = (iterator)0x95;
  file_71.m_begin = (iterator)&local_1310;
  msg_71.m_end = pvVar3;
  msg_71.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_1320,
             msg_71);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_1330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1328 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_1330,0x95);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_1370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1368 = "";
  local_1380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_72.m_end = (iterator)0x96;
  file_72.m_begin = (iterator)&local_1370;
  msg_72.m_end = pvVar3;
  msg_72.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_1380,
             msg_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"foo",(allocator<char> *)local_2f8);
  ArgsManager::GetBoolArg(&args,(string *)local_2d8,false);
  std::__cxx11::string::~string((string *)local_2d8);
  local_1390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1388 = "";
  local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x33c2e7;
  file_73.m_end = (iterator)0x96;
  file_73.m_begin = (iterator)&local_1390;
  msg_73.m_end = pvVar3;
  msg_73.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_13a0,
             msg_73);
  local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
  local_2f8._8_8_ = (element_type *)0x0;
  aStack_2e8._M_allocated_capacity = 0;
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = "exception std::runtime_error expected but not raised";
  local_13b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_13a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f8,(lazy_ostream *)local_2d8,1,1,WARN,_cVar5,
             (size_t)&local_13b0,0x96);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e8._M_allocated_capacity);
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  str_01._M_string_length = in_stack_ffffffffffffeb30;
  str_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb28;
  str_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  str_01.field_2._8_8_ = in_stack_ffffffffffffeb40;
  UniValue::UniValue((UniValue *)local_2d8,VNULL,str_01);
  test_method::anon_class_8_1_89897ddb::operator()(&set_foo,(UniValue *)local_2d8);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  local_13f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_13e8 = "";
  local_1400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_74.m_end = (iterator)0x99;
  file_74.m_begin = (iterator)&local_13f0;
  msg_74.m_end = pvVar3;
  msg_74.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_1400,
             msg_74);
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_2f8._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_2e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_2e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1408 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"foo",&local_411);
  ArgsManager::GetSetting((SettingsValue *)local_2d8,&args,&local_338);
  UniValue::write_abi_cxx11_((UniValue *)local_318,(int)local_2d8,(void *)0x0,0);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_318;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_2f8,&local_1410,0x99,1,2,pvVar4,"args.GetSetting(\"foo\").write()","null",
             "\"null\"");
  std::__cxx11::string::~string((string *)local_318);
  UniValue::~UniValue((UniValue *)local_2d8);
  std::__cxx11::string::~string((string *)&local_338);
  local_1420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1418 = "";
  local_1430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_75.m_end = (iterator)0x9a;
  file_75.m_begin = (iterator)&local_1420;
  msg_75.m_end = pvVar4;
  msg_75.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_1430,
             msg_75);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1438 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"foo",&local_411);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"default",&local_449);
  ArgsManager::GetArg((string *)local_2f8,&args,(string *)local_318,&local_338);
  pvVar3 = (iterator)0x2;
  pvVar4 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_2d8,&local_1440,0x9a,1,2,pvVar4,"args.GetArg(\"foo\", \"default\")","default",
             "\"default\"");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_318);
  local_1450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1448 = "";
  local_1460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_76.m_end = (iterator)0x9b;
  file_76.m_begin = (iterator)&local_1450;
  msg_76.m_end = pvVar4;
  msg_76.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_1460,
             msg_76);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1468 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"foo",&local_411);
  local_318._0_8_ = ArgsManager::GetIntArg(&args,(string *)local_2f8,100);
  pvVar4 = local_318;
  local_338._M_dataplus._M_p._0_4_ = 100;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2d8,&local_1470,0x9b,1,2,pvVar4,"args.GetIntArg(\"foo\", 100)",&local_338,"100");
  std::__cxx11::string::~string((string *)local_2f8);
  local_1480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1478 = "";
  local_1490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_77.m_end = (iterator)0x9c;
  file_77.m_begin = (iterator)&local_1480;
  msg_77.m_end = pvVar4;
  msg_77.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_1490,
             msg_77);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_14a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_1498 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  sVar2 = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,true);
  pvVar4 = local_318;
  local_411 = (allocator<char>)0x1;
  pvVar3 = (iterator)0x2;
  local_318[0] = sVar2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&local_14a0,0x9c,1,2,pvVar4,"args.GetBoolArg(\"foo\", true)",&local_411,
             "true");
  std::__cxx11::string::~string((string *)local_2f8);
  local_14b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/getarg_tests.cpp";
  local_14a8 = "";
  file_78.m_end = (iterator)0x9d;
  file_78.m_begin = (iterator)&local_14b0;
  msg_78.m_end = pvVar4;
  msg_78.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,
             (size_t)&stack0xffffffffffffeb40,msg_78);
  local_2d8[8] = false;
  local_2d8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"foo",(allocator<char> *)&local_338);
  local_318[0] = (string)ArgsManager::GetBoolArg(&args,(string *)local_2f8,false);
  local_411 = (allocator<char>)0x0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_2d8,&stack0xffffffffffffeb30,0x9d,1,2,local_318,"args.GetBoolArg(\"foo\", false)"
             ,&local_411,"false");
  std::__cxx11::string::~string((string *)local_2f8);
  ArgsManager::~ArgsManager(&args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(setting_args)
{
    ArgsManager args;
    SetupArgs(args, {{"-foo", ArgsManager::ALLOW_ANY}});

    auto set_foo = [&](const common::SettingsValue& value) {
      args.LockSettings([&](common::Settings& settings) {
        settings.rw_settings["foo"] = value;
      });
    };

    set_foo("str");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"str\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "str");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("99");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"99\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("3.25");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"3.25\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 3);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("0");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"0\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(99);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "99");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(3.25);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "3.25");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(0);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "0");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(true);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "true");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "1");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 1);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(false);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "false");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo(UniValue::VOBJ);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "{}");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VARR);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "[]");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VNULL);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "null");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "default");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 100);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);
}